

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_vector_push(flatcc_builder_t *B,void *data)

{
  void *data_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3a0,"void *flatcc_builder_vector_push(flatcc_builder_t *, const void *)");
  }
  if ((B->frame->container).table.vt_hash < (B->frame->container).table.pl_end) {
    if ((B->frame->container).table.vt_hash < (B->frame->container).table.pl_end) {
      __assert_fail("(B->frame[0].container.vector.count) <= (B->frame[0].container.vector.max_count)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x3a1,"void *flatcc_builder_vector_push(flatcc_builder_t *, const void *)");
    }
    B_local = (flatcc_builder_t *)0x0;
  }
  else {
    (B->frame->container).table.pl_end = (B->frame->container).table.pl_end + 1;
    B_local = (flatcc_builder_t *)push_ds_copy(B,data,(B->frame->container).table.vs_end);
  }
  return B_local;
}

Assistant:

void *flatcc_builder_vector_push(flatcc_builder_t *B, const void *data)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    check_error(frame(container.vector.count) <= frame(container.vector.max_count), 0, "vector max count exceeded");
    frame(container.vector.count) += 1;
    return push_ds_copy(B, data, frame(container.vector.elem_size));
}